

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O0

Abc_Obj_t * Abc_FlowRetime_CopyNodeToInitNtk(Abc_Obj_t *pOrigObj)

{
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pNtkNew;
  int iVar1;
  Abc_ObjType_t Type;
  int iVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  uint local_40;
  uint local_3c;
  int fCompl [2];
  void *pData;
  Abc_Obj_t *pInitObj;
  Abc_Ntk_t *pInitNtk;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pOrigObj_local;
  
  pNtk_00 = pManMR->pNtk;
  pNtkNew = pManMR->pInitNtk;
  if (pOrigObj == (Abc_Obj_t *)0x0) {
    __assert_fail("pOrigObj",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                  ,0x2e8,"Abc_Obj_t *Abc_FlowRetime_CopyNodeToInitNtk(Abc_Obj_t *)");
  }
  iVar1 = Abc_ObjIsBi(pOrigObj);
  if ((iVar1 != 0) || (iVar1 = Abc_ObjIsBo(pOrigObj), iVar1 != 0)) {
    pAVar3 = Abc_NtkCreateNodeBuf(pNtkNew,(Abc_Obj_t *)0x0);
    Abc_FlowRetime_ClearInitToOrig(pAVar3);
    return pAVar3;
  }
  iVar1 = Abc_NtkIsStrash(pNtk_00);
  if (iVar1 == 0) {
    iVar1 = Abc_NtkHasMapping(pNtk_00);
    if (iVar1 == 0) {
      pData = Abc_NtkDupObj(pNtkNew,pOrigObj,0);
      *(uint *)&((Abc_Obj_t *)pData)->field_0x14 =
           *(uint *)&((Abc_Obj_t *)pData)->field_0x14 & 0xffffff7f |
           (*(uint *)&pOrigObj->field_0x14 >> 7 & 1) << 7;
    }
    else {
      if ((pOrigObj->field_5).pData == (void *)0x0) {
        iVar1 = Abc_ObjFaninNum(pOrigObj);
        if (iVar1 == 1) {
          pAVar3 = Abc_NtkCreateNodeBuf(pNtkNew,(Abc_Obj_t *)0x0);
          Abc_FlowRetime_ClearInitToOrig(pAVar3);
          return pAVar3;
        }
        __assert_fail("Abc_ObjFaninNum(pOrigObj) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                      ,0x30f,"Abc_Obj_t *Abc_FlowRetime_CopyNodeToInitNtk(Abc_Obj_t *)");
      }
      Type = Abc_ObjType(pOrigObj);
      pData = Abc_NtkCreateObj(pNtkNew,Type);
      fCompl = (int  [2])Mio_GateReadSop((Mio_Gate_t *)(pOrigObj->field_5).pData);
      iVar1 = Abc_SopGetVarNum((char *)fCompl);
      iVar2 = Abc_ObjFaninNum(pOrigObj);
      if (iVar1 != iVar2) {
        __assert_fail("Abc_SopGetVarNum((char*)pData) == Abc_ObjFaninNum(pOrigObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                      ,0x318,"Abc_Obj_t *Abc_FlowRetime_CopyNodeToInitNtk(Abc_Obj_t *)");
      }
      pcVar4 = Abc_SopRegister((Mem_Flex_t *)pNtkNew->pManFunc,(char *)fCompl);
      (((Abc_Obj_t *)pData)->field_5).pData = pcVar4;
    }
  }
  else {
    iVar1 = Abc_AigNodeIsConst(pOrigObj);
    if (iVar1 != 0) {
      pAVar3 = Abc_NtkCreateNodeConst1(pNtkNew);
      return pAVar3;
    }
    iVar1 = Abc_ObjIsNode(pOrigObj);
    if (iVar1 == 0) {
      iVar1 = Abc_ObjFaninNum(pOrigObj);
      if (iVar1 == 1) {
        pAVar3 = Abc_NtkCreateNodeBuf(pNtkNew,(Abc_Obj_t *)0x0);
        Abc_FlowRetime_ClearInitToOrig(pAVar3);
        return pAVar3;
      }
      __assert_fail("Abc_ObjFaninNum(pOrigObj) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                    ,0x2fa,"Abc_Obj_t *Abc_FlowRetime_CopyNodeToInitNtk(Abc_Obj_t *)");
    }
    iVar1 = Abc_ObjIsNode(pOrigObj);
    if (iVar1 == 0) {
      __assert_fail("Abc_ObjIsNode(pOrigObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                    ,0x300,"Abc_Obj_t *Abc_FlowRetime_CopyNodeToInitNtk(Abc_Obj_t *)");
    }
    pData = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_NODE);
    local_40 = (uint)((*(uint *)&pOrigObj->field_0x14 >> 10 & 1) != 0);
    local_3c = (uint)((*(uint *)&pOrigObj->field_0x14 >> 0xb & 1) != 0);
    fCompl = (int  [2])Abc_SopCreateAnd((Mem_Flex_t *)pNtkNew->pManFunc,2,(int *)&local_40);
    if (fCompl == (int  [2])0x0) {
      __assert_fail("pData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                    ,0x307,"Abc_Obj_t *Abc_FlowRetime_CopyNodeToInitNtk(Abc_Obj_t *)");
    }
    pcVar4 = Abc_SopRegister((Mem_Flex_t *)pNtkNew->pManFunc,(char *)fCompl);
    (((Abc_Obj_t *)pData)->field_5).pData = pcVar4;
  }
  if (pData != (void *)0x0) {
    return (Abc_Obj_t *)pData;
  }
  __assert_fail("pInitObj",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                ,0x325,"Abc_Obj_t *Abc_FlowRetime_CopyNodeToInitNtk(Abc_Obj_t *)");
}

Assistant:

Abc_Obj_t *Abc_FlowRetime_CopyNodeToInitNtk( Abc_Obj_t *pOrigObj ) {
  Abc_Ntk_t *pNtk = pManMR->pNtk;
  Abc_Ntk_t *pInitNtk = pManMR->pInitNtk;
  Abc_Obj_t *pInitObj;
  void *pData;
  int fCompl[2];

  assert(pOrigObj);

  // what we do depends on the ntk types of original / init networks...
  
  // (0) convert BI/BO nodes to buffers
  if (Abc_ObjIsBi( pOrigObj ) || Abc_ObjIsBo( pOrigObj ) ) {
    pInitObj =  Abc_NtkCreateNodeBuf( pInitNtk, NULL );
    Abc_FlowRetime_ClearInitToOrig( pInitObj );
    return pInitObj;
  }

  // (i) strash node -> SOP node
  if (Abc_NtkIsStrash( pNtk )) {

    if (Abc_AigNodeIsConst( pOrigObj )) {
      return Abc_NtkCreateNodeConst1( pInitNtk );
    }
    if (!Abc_ObjIsNode( pOrigObj )) {
      assert(Abc_ObjFaninNum(pOrigObj) == 1);
      pInitObj =  Abc_NtkCreateNodeBuf( pInitNtk, NULL );
      Abc_FlowRetime_ClearInitToOrig( pInitObj );
      return pInitObj;
    }

    assert( Abc_ObjIsNode(pOrigObj) );
    pInitObj = Abc_NtkCreateObj( pInitNtk, ABC_OBJ_NODE );
    
    fCompl[0] = pOrigObj->fCompl0 ? 1 : 0;
    fCompl[1] = pOrigObj->fCompl1 ? 1 : 0;
    
    pData =  Abc_SopCreateAnd( (Mem_Flex_t *)pInitNtk->pManFunc, 2, fCompl );
    assert(pData);
    pInitObj->pData = Abc_SopRegister( (Mem_Flex_t *)pInitNtk->pManFunc, (const char*)pData );
  } 

  // (ii) mapped node -> SOP node
  else if (Abc_NtkHasMapping( pNtk )) {
    if (!pOrigObj->pData) {
      // assume terminal...
      assert(Abc_ObjFaninNum(pOrigObj) == 1);

      pInitObj =  Abc_NtkCreateNodeBuf( pInitNtk, NULL );
      Abc_FlowRetime_ClearInitToOrig( pInitObj );
      return pInitObj;
    }

    pInitObj = Abc_NtkCreateObj( pInitNtk, (Abc_ObjType_t)Abc_ObjType(pOrigObj) );
    pData = Mio_GateReadSop((Mio_Gate_t*)pOrigObj->pData);
    assert( Abc_SopGetVarNum((char*)pData) == Abc_ObjFaninNum(pOrigObj) );
    
    pInitObj->pData = Abc_SopRegister( (Mem_Flex_t *)pInitNtk->pManFunc, (const char*)pData );
  } 

  // (iii) otherwise, duplicate obj
  else {
    pInitObj = Abc_NtkDupObj( pInitNtk, pOrigObj, 0 );
    
    // copy phase
    pInitObj->fPhase = pOrigObj->fPhase;
  }

  assert(pInitObj);
  return pInitObj;
}